

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# helicsApp.cpp
# Opt level: O2

void __thiscall helics::apps::App::loadInputFiles(App *this)

{
  if ((this->configFileName)._M_string_length != 0) {
    loadFile(this,&this->configFileName,false);
  }
  if ((this->inputFileName)._M_string_length != 0) {
    loadFile(this,&this->inputFileName,true);
    return;
  }
  return;
}

Assistant:

void App::loadInputFiles()
{
    if (!configFileName.empty()) {
        /** this one would have been loaded through the federate already*/
        loadFile(configFileName, false);
    }
    if (!inputFileName.empty()) {
        loadFile(inputFileName, true);
    }
}